

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysc_ident_free(lysf_ctx *ctx,lysc_ident *ident)

{
  lysc_ext_instance *plVar1;
  long lVar2;
  void *pvVar3;
  
  lydict_remove(ctx->ctx,ident->name);
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  if (ident->derived != (lysc_ident **)0x0) {
    free(ident->derived + -1);
  }
  plVar1 = ident->exts;
  if (plVar1 != (lysc_ext_instance *)0x0) {
    pvVar3 = (void *)0xffffffffffffffff;
    lVar2 = 0;
    do {
      pvVar3 = (void *)((long)pvVar3 + 1);
      if (plVar1[-1].compiled <= pvVar3) {
        free(&plVar1[-1].compiled);
        return;
      }
      plVar1 = (lysc_ext_instance *)((long)&plVar1->def + lVar2);
      lVar2 = lVar2 + 0x48;
      lysc_ext_instance_free(ctx,plVar1);
      plVar1 = ident->exts;
    } while (plVar1 != (lysc_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysc_ident_free(struct lysf_ctx *ctx, struct lysc_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    LY_ARRAY_FREE(ident->derived);
    FREE_ARRAY(ctx, ident->exts, lysc_ext_instance_free);
}